

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O3

int Cec_ManHandleSpecialCases(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  undefined1 *puVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  Abc_Cex_t *pAVar14;
  uint uVar15;
  int iVar16;
  Gia_Man_t *pGVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  Gia_Obj_t *pGVar21;
  timespec ts;
  long local_80;
  timespec local_70;
  ulong local_60;
  int local_54;
  Gia_Obj_t *local_50;
  Vec_Int_t *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  iVar8 = clock_gettime(3,&local_70);
  if (iVar8 < 0) {
    local_80 = -1;
  }
  else {
    local_80 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  pGVar17 = p;
  Gia_ManSetPhase(p);
  iVar8 = p->nRegs;
  pVVar5 = p->vCos;
  uVar4 = pVVar5->nSize;
  uVar15 = uVar4 - iVar8;
  if (uVar15 == 0 || (int)uVar4 < iVar8) {
    uVar20 = p->nObjs;
  }
  else {
    local_38 = (undefined1 *)(ulong)uVar15;
    local_40 = (undefined1 *)(ulong)uVar4;
    pGVar12 = (Gia_Man_t *)0x0;
    uVar10 = 0;
    do {
      local_54 = iVar8;
      local_48 = pVVar5;
      if ((long)(int)uVar4 <= (long)pGVar12) {
LAB_006433d0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = pVVar5->pArray[(long)pGVar12];
      if (((long)iVar9 < 0) || (uVar20 = p->nObjs, (int)uVar20 <= iVar9)) {
LAB_006433b1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = p->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      puVar1 = (undefined1 *)((long)&pGVar12->pName + 1);
      if (local_38 <= puVar1) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (local_40 <= puVar1) goto LAB_006433d0;
      uVar18 = pVVar5->pArray[(long)((long)&pGVar12->pName + 1)];
      lVar13 = (long)(int)uVar18;
      if ((lVar13 < 0) || (uVar20 <= uVar18)) goto LAB_006433b1;
      pGVar2 = pGVar6 + iVar9;
      iVar9 = (int)puVar1;
      iVar16 = (int)uVar10;
      if ((long)(*(ulong *)(pGVar6 + lVar13) ^ *(ulong *)pGVar2) < 0) {
        if (pPars->fSilent == 0) {
          Abc_Print(iVar9,
                    "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ",
                    uVar10);
          iVar9 = 3;
          iVar8 = clock_gettime(3,&local_70);
          if (iVar8 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          Abc_Print(iVar9,"%s =","Time");
          Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar13 - local_80) / 1000000.0);
        }
        pPars->iOutFail = iVar16;
        Cec_ManTransformPattern(p,iVar16,(int *)0x0);
        return 0;
      }
      pGVar3 = pGVar6 + lVar13;
      pGVar21 = pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff);
      pGVar6 = pGVar3 + -(*(ulong *)(pGVar6 + lVar13) & 0x1fffffff);
      uVar7 = *(ulong *)pGVar21;
      local_60 = uVar10;
      if (((uint)uVar7 & 0x9fffffff) == 0x9fffffff) {
        uVar18 = p->vCis->nSize - iVar8;
        uVar19 = *(ulong *)pGVar6;
        if ((int)uVar18 <= (int)((uint)(uVar7 >> 0x20) & 0x1fffffff)) goto LAB_00642f77;
        local_50 = pGVar3;
        if (((((uint)uVar19 & 0x9fffffff) == 0x9fffffff) &&
            (((uint)(uVar19 >> 0x20) & 0x1fffffff) < uVar18)) && (pGVar21 != pGVar6)) {
          if (pPars->fSilent == 0) {
            Abc_Print(iVar9,
                      "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ",
                      uVar10);
            iVar9 = 3;
            iVar8 = clock_gettime(3,&local_70);
            if (iVar8 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
            }
            Abc_Print(iVar9,"%s =","Time");
            Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar13 - local_80) / 1000000.0);
          }
          pPars->iOutFail = (int)local_60;
          Cec_ManTransformPattern(p,(int)local_60,(int *)0x0);
          if (((*(uint *)pGVar3 ^ *(uint *)pGVar2) >> 0x1d & 1) != 0) {
            __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                          ,0xb3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
          }
          uVar10 = *(ulong *)pGVar21;
          if (-1 < (int)uVar10) goto LAB_0064342d;
          bVar11 = (byte)(uVar10 >> 0x20);
          pAVar14 = p->pCexComb;
          goto LAB_00643302;
        }
        if ((~uVar19 & 0x1fffffff1fffffff) != 0) goto LAB_00642f77;
LAB_006430cd:
        if (pPars->fSilent == 0) {
          Abc_Print(iVar9,
                    "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ",
                    uVar10);
          iVar9 = 3;
          iVar8 = clock_gettime(3,&local_70);
          if (iVar8 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          Abc_Print(iVar9,"%s =","Time");
          Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar13 - local_80) / 1000000.0);
        }
        pPars->iOutFail = (int)local_60;
        Cec_ManTransformPattern(p,(int)local_60,(int *)0x0);
        if (((*(uint *)pGVar3 ^ *(uint *)pGVar2) >> 0x1d & 1) != 0) {
          __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                        ,0xc3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
        }
        uVar10 = *(ulong *)pGVar21;
        if (((((uint)uVar10 & 0x9fffffff) != 0x9fffffff) ||
            (p->vCis->nSize - p->nRegs <= (int)((uint)(uVar10 >> 0x20) & 0x1fffffff))) &&
           (uVar10 = *(ulong *)pGVar6, -1 < (int)uVar10)) {
LAB_0064342d:
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        bVar11 = (byte)(uVar10 >> 0x20);
        pAVar14 = p->pCexComb;
LAB_00643302:
        (&pAVar14[1].iPo)[(uint)(uVar10 >> 0x25) & 0xffffff] =
             (&pAVar14[1].iPo)[(uint)(uVar10 >> 0x25) & 0xffffff] | 1 << (bVar11 & 0x1f);
        return 0;
      }
      uVar19 = *(ulong *)pGVar6;
LAB_00642f77:
      if (((((uint)uVar19 & 0x9fffffff) == 0x9fffffff) && ((~uVar7 & 0x1fffffff1fffffff) == 0)) &&
         ((int)((uint)(uVar19 >> 0x20) & 0x1fffffff) < p->vCis->nSize - iVar8)) goto LAB_006430cd;
      pGVar12 = (Gia_Man_t *)((long)&pGVar12->pName + 2);
      pGVar17 = pGVar12;
      uVar10 = (ulong)(iVar16 + 1);
    } while ((int)pGVar12 < (int)uVar15);
  }
  iVar8 = -1;
  if ((uVar20 == uVar4 + p->vCis->nSize + 1) && (iVar8 = 1, pPars->fSilent == 0)) {
    Abc_Print((int)pGVar17,"Networks are equivalent.  ");
    iVar16 = 3;
    iVar9 = clock_gettime(3,&local_70);
    if (iVar9 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Abc_Print(iVar16,"%s =","Time");
    Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar13 - local_80) / 1000000.0);
  }
  return iVar8;
}

Assistant:

int Cec_ManHandleSpecialCases( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    Gia_Obj_t * pObj1, * pObj2;
    Gia_Obj_t * pDri1, * pDri2;
    int i;
    abctime clk = Abc_Clock();
    Gia_ManSetPhase( p );
    Gia_ManForEachPo( p, pObj1, i )
    {
        pObj2 = Gia_ManPo( p, ++i );
        // check if they different on all-0 pattern
        // (for example, when they have the same driver but complemented)
        if ( Gia_ObjPhase(pObj1) != Gia_ObjPhase(pObj2) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            return 0;
        }
        // get the drivers
        pDri1 = Gia_ObjFanin0(pObj1);
        pDri2 = Gia_ObjFanin0(pObj2);
        // drivers are different PIs
        if ( Gia_ObjIsPi(p, pDri1) && Gia_ObjIsPi(p, pDri2) && pDri1 != pDri2 )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // if their compl attributes are the same - one should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            return 0;
        }
        // one of the drivers is a PI; another is a constant 0
        if ( (Gia_ObjIsPi(p, pDri1) && Gia_ObjIsConst0(pDri2)) || 
             (Gia_ObjIsPi(p, pDri2) && Gia_ObjIsConst0(pDri1)) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // the compl attributes are the same - the PI should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            if ( Gia_ObjIsPi(p, pDri1) )
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            else
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri2) );
            return 0;
        }
    }
    if ( Gia_ManAndNum(p) == 0 )
    {
        if ( !pPars->fSilent )
        {
        Abc_Print( 1, "Networks are equivalent.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        return 1;
    }
    return -1;
}